

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-common.hpp
# Opt level: O0

double __thiscall
baryonyx::itm::quadratic_cost_type<double>::min(quadratic_cost_type<double> *this,int n)

{
  type pdVar1;
  double *pdVar2;
  type piVar3;
  type pqVar4;
  unique_ptr<double[],_std::default_delete<double[]>_> *this_00;
  unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
  *this_01;
  double dVar5;
  double local_40;
  int local_38;
  int local_34;
  int e;
  int i_1;
  int local_24;
  double dStack_20;
  int i;
  double min;
  quadratic_cost_type<double> *pqStack_10;
  int n_local;
  quadratic_cost_type<double> *this_local;
  
  min._4_4_ = n;
  pqStack_10 = this;
  dStack_20 = std::numeric_limits<double>::max();
  for (local_24 = 0; local_24 != min._4_4_; local_24 = local_24 + 1) {
    pdVar1 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->linear_elements,(long)local_24);
    if ((*pdVar1 != 0.0) || (NAN(*pdVar1))) {
      this_00 = &this->linear_elements;
      pdVar1 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                         (this_00,(long)local_24);
      dVar5 = *pdVar1;
      std::abs((int)this_00);
      _e = dVar5;
      pdVar2 = std::min<double>(&stack0xffffffffffffffe0,(double *)&e);
      dStack_20 = *pdVar2;
    }
  }
  local_34 = 0;
  piVar3 = std::unique_ptr<int[],_std::default_delete<int[]>_>::operator[]
                     (&this->indices,(long)min._4_4_);
  local_38 = *piVar3;
  for (; local_34 != local_38; local_34 = local_34 + 1) {
    pqVar4 = std::
             unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
             ::operator[](&this->quadratic_elements,(long)local_34);
    if ((pqVar4->factor != 0.0) || (NAN(pqVar4->factor))) {
      this_01 = &this->quadratic_elements;
      pqVar4 = std::
               unique_ptr<baryonyx::itm::quadratic_cost_type<double>::quad[],_std::default_delete<baryonyx::itm::quadratic_cost_type<double>::quad[]>_>
               ::operator[](this_01,(long)local_34);
      dVar5 = pqVar4->factor;
      std::abs((int)this_01);
      local_40 = dVar5;
      pdVar2 = std::min<double>(&stack0xffffffffffffffe0,&local_40);
      dStack_20 = *pdVar2;
    }
  }
  return dStack_20;
}

Assistant:

Float min(int n) const noexcept
    {
        Float min = std::numeric_limits<Float>::max();

        for (int i = 0; i != n; ++i)
            if (linear_elements[i])
                min = std::min(min, std::abs(linear_elements[i]));

        for (int i = 0, e = indices[n]; i != e; ++i)
            if (quadratic_elements[i].factor)
                min = std::min(min, std::abs(quadratic_elements[i].factor));

        return min;
    }